

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool __thiscall QPDF::allowAccessibility(QPDF *this)

{
  bool bVar1;
  bool local_19;
  int local_18;
  int iStack_14;
  bool status;
  int P;
  int R;
  QPDF *this_local;
  
  iStack_14 = 0;
  local_18 = 0;
  local_19 = true;
  _P = this;
  bVar1 = isEncrypted(this,&stack0xffffffffffffffec,&local_18);
  if (bVar1) {
    if (iStack_14 < 3) {
      local_19 = is_bit_set(local_18,5);
    }
    else {
      local_19 = is_bit_set(local_18,10);
    }
  }
  return local_19;
}

Assistant:

bool
QPDF::allowAccessibility()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        if (R < 3) {
            status = is_bit_set(P, 5);
        } else {
            status = is_bit_set(P, 10);
        }
    }
    return status;
}